

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O3

bool __thiscall AActor::FixMapthingPos(AActor *this)

{
  double *pdVar1;
  sector_t *psVar2;
  sector_t *psVar3;
  uint uVar4;
  int iVar5;
  undefined4 extraout_var;
  char *pcVar7;
  bool bVar8;
  uint uVar9;
  undefined8 in_R9;
  line_t *plVar10;
  int *piVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  PClass *pPVar6;
  
  dVar15 = (this->__Pos).X;
  dVar16 = (this->__Pos).Y;
  P_PointInSectorBuggy(dVar15,dVar16);
  uVar4 = (uint)((dVar15 - bmaporgx) * 0.0078125);
  bVar8 = false;
  if ((uVar4 < (uint)bmapwidth) &&
     (uVar9 = (uint)((dVar16 - bmaporgy) * 0.0078125), uVar9 < (uint)bmapheight)) {
    iVar5 = blockmaplump[(long)blockmap[(int)(bmapwidth * uVar9 + uVar4)] + 1];
    if (iVar5 == -1) {
      bVar8 = false;
    }
    else {
      piVar11 = blockmaplump + (long)blockmap[(int)(bmapwidth * uVar9 + uVar4)] + 2;
      bVar8 = false;
      do {
        psVar2 = lines[iVar5].frontsector;
        psVar3 = lines[iVar5].backsector;
        if (psVar2 != psVar3) {
          if (psVar3 != (sector_t *)0x0) {
            dVar15 = (psVar2->floorplane).normal.X;
            if ((dVar15 == (psVar3->floorplane).normal.X) &&
               (!NAN(dVar15) && !NAN((psVar3->floorplane).normal.X))) {
              dVar15 = (psVar2->floorplane).normal.Y;
              pdVar1 = &(psVar3->floorplane).normal.Y;
              if ((dVar15 == *pdVar1) && (!NAN(dVar15) && !NAN(*pdVar1))) {
                dVar15 = (psVar2->floorplane).normal.Z;
                pdVar1 = &(psVar3->floorplane).normal.Z;
                if ((dVar15 == *pdVar1) && (!NAN(dVar15) && !NAN(*pdVar1))) {
                  dVar15 = (psVar2->floorplane).D;
                  pdVar1 = &(psVar3->floorplane).D;
                  if ((dVar15 == *pdVar1) && (!NAN(dVar15) && !NAN(*pdVar1))) {
                    dVar15 = (psVar2->ceilingplane).normal.X;
                    if ((dVar15 == (psVar3->ceilingplane).normal.X) &&
                       (!NAN(dVar15) && !NAN((psVar3->ceilingplane).normal.X))) {
                      dVar15 = (psVar2->ceilingplane).normal.Y;
                      pdVar1 = &(psVar3->ceilingplane).normal.Y;
                      if ((dVar15 == *pdVar1) && (!NAN(dVar15) && !NAN(*pdVar1))) {
                        dVar15 = (psVar2->ceilingplane).normal.Z;
                        pdVar1 = &(psVar3->ceilingplane).normal.Z;
                        if ((dVar15 == *pdVar1) && (!NAN(dVar15) && !NAN(*pdVar1))) {
                          dVar15 = (psVar2->ceilingplane).D;
                          pdVar1 = &(psVar3->ceilingplane).D;
                          if ((dVar15 == *pdVar1) && (!NAN(dVar15) && !NAN(*pdVar1)))
                          goto LAB_00546b0b;
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          plVar10 = lines + iVar5;
          dVar15 = (this->__Pos).X;
          dVar16 = this->radius;
          if ((((plVar10->bbox[2] < dVar15 + dVar16) && (dVar15 - dVar16 < plVar10->bbox[3])) &&
              (dVar15 = (this->__Pos).Y, plVar10->bbox[1] < dVar16 + dVar15)) &&
             (dVar15 - dVar16 < plVar10->bbox[0])) {
            dVar15 = (plVar10->delta).X;
            dVar16 = (plVar10->delta).Y;
            dVar12 = c_sqrt(dVar16 * dVar16 + dVar15 * dVar15);
            dVar15 = (plVar10->delta).X;
            dVar16 = (plVar10->delta).Y;
            auVar13._0_8_ = -dVar15;
            auVar13._8_8_ = dVar16;
            auVar14._8_8_ = dVar12;
            auVar14._0_8_ = dVar12;
            auVar14 = divpd(auVar13,auVar14);
            dVar12 = auVar14._8_8_ * dVar16 - auVar14._0_8_ * dVar15;
            dVar17 = 0.0;
            dVar18 = 0.0;
            if ((dVar12 != 0.0) || (NAN(dVar12))) {
              dVar18 = ((plVar10->v1->p).X - (this->__Pos).X) * dVar16;
              dVar17 = (dVar18 + ((this->__Pos).Y - (plVar10->v1->p).Y) * dVar15) / dVar12;
            }
            dVar17 = ABS(dVar17);
            dVar18 = ABS(dVar18);
            if (dVar17 < this->radius) {
              pPVar6 = (this->super_DThinker).super_DObject.Class;
              if (pPVar6 == (PClass *)0x0) {
                iVar5 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
                pPVar6 = (PClass *)CONCAT44(extraout_var,iVar5);
                (this->super_DThinker).super_DObject.Class = pPVar6;
                dVar15 = (plVar10->delta).X;
              }
              pcVar7 = "vertical";
              if ((dVar15 != 0.0) || (NAN(dVar15))) {
                pdVar1 = &(plVar10->delta).Y;
                pcVar7 = "horizontal";
                if (*pdVar1 != 0.0) {
                  pcVar7 = "diagonal";
                }
                if (NAN(*pdVar1)) {
                  pcVar7 = "diagonal";
                }
              }
              DPrintf(3,"%s at (%f,%f) lies on %s line %td, distance = %f\n",(this->__Pos).X,
                      (this->__Pos).Y,dVar17,
                      FName::NameData.NameArray
                      [(pPVar6->super_PStruct).super_PNamedType.TypeName.Index].Text,pcVar7,
                      ((long)plVar10 - (long)lines >> 3) * -0x79435e50d79435e5,in_R9,dVar17,dVar18);
              c_atan2((plVar10->delta).Y,(plVar10->delta).X);
              dVar17 = this->radius - dVar17;
              dVar15 = (this->__Pos).X;
              dVar16 = (this->__Pos).Y;
              dVar12 = FFastTrig::cos(&fasttrig,dVar15);
              dVar18 = FFastTrig::sin(&fasttrig,dVar12);
              dVar15 = dVar12 * dVar17 + dVar15;
              dVar16 = dVar18 * dVar17 + dVar16;
              (this->__Pos).X = dVar15;
              (this->__Pos).Y = dVar16;
              (this->Prev).Z = (this->__Pos).Z;
              (this->Prev).X = dVar15;
              (this->Prev).Y = dVar16;
              (this->PrevAngles).Roll.Degrees = (this->Angles).Roll.Degrees;
              dVar15 = (this->Angles).Yaw.Degrees;
              (this->PrevAngles).Pitch.Degrees = (this->Angles).Pitch.Degrees;
              (this->PrevAngles).Yaw.Degrees = dVar15;
              if (this->Sector == (sector_t *)0x0) {
                iVar5 = 0;
              }
              else {
                iVar5 = this->Sector->PortalGroup;
              }
              this->PrevPortalGroup = iVar5;
              bVar8 = true;
            }
          }
        }
LAB_00546b0b:
        iVar5 = *piVar11;
        piVar11 = piVar11 + 1;
      } while (iVar5 != -1);
    }
  }
  return bVar8;
}

Assistant:

bool AActor::FixMapthingPos()
{
	sector_t *secstart = P_PointInSectorBuggy(X(), Y());

	int blockx = GetBlockX(X());
	int blocky = GetBlockY(Y());
	bool success = false;

	if ((unsigned int)blockx < (unsigned int)bmapwidth &&
		(unsigned int)blocky < (unsigned int)bmapheight)
	{
		int *list;

		for (list = blockmaplump + blockmap[blocky*bmapwidth + blockx] + 1; *list != -1; ++list)
		{
			line_t *ldef = &lines[*list];

			if (ldef->frontsector == ldef->backsector)
			{ // Skip two-sided lines inside a single sector
				continue;
			}
			if (ldef->backsector != NULL)
			{
				if (ldef->frontsector->floorplane == ldef->backsector->floorplane &&
					ldef->frontsector->ceilingplane == ldef->backsector->ceilingplane)
				{ // Skip two-sided lines without any height difference on either side
					continue;
				}
			}

			// Not inside the line's bounding box
			if (X() + radius <= ldef->bbox[BOXLEFT]
				|| X() - radius >= ldef->bbox[BOXRIGHT]
				|| Y() + radius <= ldef->bbox[BOXBOTTOM]
				|| Y() - radius >= ldef->bbox[BOXTOP])
				continue;

			// Get the exact distance to the line
			divline_t dll, dlv;
			double linelen = ldef->Delta().Length();

			P_MakeDivline(ldef, &dll);

			dlv.x = X();
			dlv.y = Y();
			dlv.dx = dll.dy / linelen;
			dlv.dy = -dll.dx / linelen;

			double distance = fabs(P_InterceptVector(&dlv, &dll));

			if (distance < radius)
			{
				DPrintf(DMSG_NOTIFY, "%s at (%f,%f) lies on %s line %td, distance = %f\n",
					this->GetClass()->TypeName.GetChars(), X(), Y(),
					ldef->Delta().X == 0 ? "vertical" : ldef->Delta().Y == 0 ? "horizontal" : "diagonal",
					ldef - lines, distance);
				DAngle ang = ldef->Delta().Angle();
				if (ldef->backsector != NULL && ldef->backsector == secstart)
				{
					ang += 90.;
				}
				else
				{
					ang -= 90.;
				}

				// Get the distance we have to move the object away from the wall
				distance = radius - distance;
				SetXY(Pos().XY() + ang.ToVector(distance));
				ClearInterpolation();
				success = true;
			}
		}
	}
	return success;
}